

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall google::protobuf::DynamicMessage::CrossLinkPrototypes(DynamicMessage *this)

{
  int iVar1;
  Descriptor *pDVar2;
  long lVar3;
  LogMessage *other;
  TypeInfo *pTVar4;
  int *piVar5;
  Message *pMVar6;
  long lVar7;
  long i;
  LogFinisher local_71;
  DynamicMessageFactory *local_70;
  LogMessage local_68;
  
  pTVar4 = this->type_info_;
  if (pTVar4->prototype != (DynamicMessage *)0x0 && pTVar4->prototype != this) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/dynamic_message.cc"
               ,0x18c);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: is_prototype(): ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
    pTVar4 = this->type_info_;
  }
  pDVar2 = pTVar4->type;
  if (0 < *(int *)(pDVar2 + 0x2c)) {
    local_70 = pTVar4->factory;
    lVar7 = 0x2c;
    i = 0;
    do {
      lVar3 = *(long *)(pDVar2 + 0x30);
      piVar5 = internal::scoped_array<int>::operator[](&this->type_info_->offsets,i);
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar3 + lVar7) * 4) == 10)
         && (*(int *)(lVar3 + 4 + lVar7) != 3)) {
        iVar1 = *piVar5;
        pMVar6 = DynamicMessageFactory::GetPrototypeNoLock
                           (local_70,*(Descriptor **)(lVar3 + 0x1c + lVar7));
        *(Message **)
         ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + (long)iVar1) = pMVar6;
      }
      i = i + 1;
      lVar7 = lVar7 + 0x78;
    } while (i < *(int *)(pDVar2 + 0x2c));
  }
  return;
}

Assistant:

void DynamicMessage::CrossLinkPrototypes() {
  // This should only be called on the prototype message.
  GOOGLE_CHECK(is_prototype());

  DynamicMessageFactory* factory = type_info_->factory;
  const Descriptor* descriptor = type_info_->type;

  // Cross-link default messages.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !field->is_repeated()) {
      // For fields with message types, we need to cross-link with the
      // prototype for the field's type.
      // For singular fields, the field is just a pointer which should
      // point to the prototype.
      *reinterpret_cast<const Message**>(field_ptr) =
        factory->GetPrototypeNoLock(field->message_type());
    }
  }
}